

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_type.cpp
# Opt level: O3

void duckdb::VectorTypeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  reference pvVar2;
  char *pcVar3;
  anon_struct_16_3_d7536bce_for_pointer aVar4;
  allocator local_39;
  string local_38;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  paVar1 = (anon_union_16_2_67f50693_for_value *)result->data;
  pvVar2 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  pcVar3 = EnumUtil::ToChars<duckdb::VectorType>(pvVar2->vector_type);
  ::std::__cxx11::string::string((string *)&local_38,pcVar3,&local_39);
  aVar4 = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(result,&local_38);
  paVar1->pointer = aVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void VectorTypeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto data = ConstantVector::GetData<string_t>(result);
	data[0] = StringVector::AddString(result, EnumUtil::ToString(input.data[0].GetVectorType()));
}